

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_api_tests.cpp
# Opt level: O0

void decode_and_encode_c1_minimalExample_producesSameResult(void)

{
  __type _Var1;
  undefined1 local_c8 [8];
  string bstr2;
  DecodedResult decodedResult;
  undefined1 local_60 [8];
  string expectedHrp;
  allocator<char> local_29;
  undefined1 local_28 [8];
  string bstr1;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_28,"a12uel5l",&local_29);
  std::allocator<char>::~allocator(&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"a",
             (allocator<char> *)
             ((long)&decodedResult.dp.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&decodedResult.dp.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  bech32::decode((DecodedResult *)((long)&bstr2.field_2 + 8),(string *)local_28);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&decodedResult);
  if (!_Var1) {
    __assert_fail("expectedHrp == decodedResult.hrp",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_api_tests.cpp"
                  ,0xd2,"void decode_and_encode_c1_minimalExample_producesSameResult()");
  }
  if (bstr2.field_2._8_4_ == 1) {
    bech32::encodeUsingOriginalConstant
              ((string *)local_c8,(string *)&decodedResult,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&decodedResult.hrp.field_2 + 8));
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_c8);
    if (!_Var1) {
      __assert_fail("bstr1 == bstr2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_api_tests.cpp"
                    ,0xd7,"void decode_and_encode_c1_minimalExample_producesSameResult()");
    }
    std::__cxx11::string::~string((string *)local_c8);
    bech32::DecodedResult::~DecodedResult((DecodedResult *)((long)&bstr2.field_2 + 8));
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)local_28);
    return;
  }
  __assert_fail("bech32::Encoding::Bech32 == decodedResult.encoding",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_api_tests.cpp"
                ,0xd3,"void decode_and_encode_c1_minimalExample_producesSameResult()");
}

Assistant:

void decode_and_encode_c1_minimalExample_producesSameResult() {
    std::string bstr1 = "a12uel5l";
    std::string expectedHrp = "a";

    bech32::DecodedResult decodedResult = bech32::decode(bstr1);

    assert(expectedHrp == decodedResult.hrp);
    assert(bech32::Encoding::Bech32 == decodedResult.encoding);

    std::string bstr2 = bech32::encodeUsingOriginalConstant(decodedResult.hrp, decodedResult.dp);

    assert(bstr1 == bstr2);
}